

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendPathName(JsonEachCursor *p)

{
  bool bVar1;
  u32 uVar2;
  byte *pbVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int needQuote;
  char *z;
  u32 i;
  u32 k;
  u32 n;
  u32 sz;
  uint local_24;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(in_RDI + 0x18) == '\v') {
    jsonPrintf(0x1e,(JsonString *)(in_RDI + 0x38),"[%lld]",
               *(undefined8 *)
                (*(long *)(in_RDI + 0x28) + (ulong)(*(int *)(in_RDI + 0x1c) - 1) * 0x18 + 0x10));
  }
  else {
    local_c = 0;
    bVar1 = false;
    uVar2 = jsonbPayloadSize((JsonParse *)(in_RDI + 0xc0),*(u32 *)(in_RDI + 0xc),&local_c);
    pbVar3 = (byte *)(*(long *)(in_RDI + 0xc0) + (ulong)(*(int *)(in_RDI + 0xc) + uVar2));
    if ((local_c == 0) || ((""[*pbVar3] & 2) == 0)) {
      bVar1 = true;
    }
    else {
      for (local_24 = 0; local_24 < local_c; local_24 = local_24 + 1) {
        if ((""[pbVar3[local_24]] & 6) == 0) {
          bVar1 = true;
          break;
        }
      }
    }
    if (bVar1) {
      jsonPrintf((int)(ulong)(local_c + 4),(JsonString *)(in_RDI + 0x38),".\"%.*s\"",(ulong)local_c,
                 pbVar3);
    }
    else {
      jsonPrintf((int)(ulong)(local_c + 2),(JsonString *)(in_RDI + 0x38),".%.*s",(ulong)local_c,
                 pbVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonAppendPathName(JsonEachCursor *p){
  assert( p->nParent>0 );
  assert( p->eType==JSONB_ARRAY || p->eType==JSONB_OBJECT );
  if( p->eType==JSONB_ARRAY ){
    jsonPrintf(30, &p->path, "[%lld]", p->aParent[p->nParent-1].iKey);
  }else{
    u32 n, sz = 0, k, i;
    const char *z;
    int needQuote = 0;
    n = jsonbPayloadSize(&p->sParse, p->i, &sz);
    k = p->i + n;
    z = (const char*)&p->sParse.aBlob[k];
    if( sz==0 || !sqlite3Isalpha(z[0]) ){
      needQuote = 1;
    }else{
      for(i=0; i<sz; i++){
        if( !sqlite3Isalnum(z[i]) ){
          needQuote = 1;
          break;
        }
      }
    }
    if( needQuote ){
      jsonPrintf(sz+4,&p->path,".\"%.*s\"", sz, z);
    }else{
      jsonPrintf(sz+2,&p->path,".%.*s", sz, z);
    }
  }
}